

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff70;
  TPZGeoTriangle *in_stack_ffffffffffffff80;
  TPZCompEl **local_60;
  TPZGeoElSideIndex local_40;
  int local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoTriangle>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024449e0);
  TPZGeoEl::TPZGeoEl(in_RDI,&PTR_PTR_024449c8);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_024446c8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_024446c8;
  pzgeom::TPZGeoTriangle::TPZGeoTriangle(in_stack_ffffffffffffff80);
  local_60 = &in_RDI[1].fReference;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    local_60 = local_60 + 3;
  } while ((TPZGeoMesh **)local_60 != &in_RDI[4].fMesh);
  for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[1].fReference + (long)local_28 * 3),&local_40);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1bb9125);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}